

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O2

bool cmIncludeGuardCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  string *input;
  cmValue cVar4;
  cmState *pcVar5;
  cmake *this;
  int iVar6;
  string includeGuardVar;
  cmStateDirectory stateDir;
  cmStateSnapshot dirSnapshot;
  cmStateSnapshot local_48;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__lhs)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stateDir,
               "given an invalid number of arguments. The command takes at most 1 argument.",
               (allocator<char> *)&includeGuardVar);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002394ee:
    std::__cxx11::string::~string((string *)&stateDir);
    return false;
  }
  if (__lhs == pbVar1) {
    iVar6 = 0;
  }
  else {
    bVar3 = std::operator==(__lhs,"DIRECTORY");
    if (bVar3) {
      iVar6 = 1;
    }
    else {
      bVar3 = std::operator==(__lhs,"GLOBAL");
      if (!bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stateDir,"given an invalid scope: ",__lhs);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002394ee;
      }
      iVar6 = 2;
    }
  }
  pcVar2 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirSnapshot,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&local_48);
  input = (string *)cmMakefile::GetDefinition(pcVar2,(string *)&dirSnapshot);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includeGuardVar,"__INCGUARD_",(allocator<char> *)&stateDir);
  if (input == (string *)0x0) {
    input = &cmValue::Empty_abi_cxx11_;
  }
  cmSystemTools::ComputeStringMD5((string *)&stateDir,input);
  std::__cxx11::string::append((string *)&includeGuardVar);
  std::__cxx11::string::~string((string *)&stateDir);
  std::__cxx11::string::append((char *)&includeGuardVar);
  std::__cxx11::string::~string((string *)&dirSnapshot);
  pcVar2 = status->Makefile;
  if (iVar6 == 0) {
    bVar3 = cmMakefile::IsDefinitionSet(pcVar2,&includeGuardVar);
    if (!bVar3) {
      cmMakefile::AddDefinitionBool(pcVar2,&includeGuardVar,true);
      goto LAB_002396b7;
    }
  }
  else if (iVar6 == 1) {
    cVar4 = cmMakefile::GetProperty(pcVar2,&includeGuardVar);
    if (cVar4.Value == (string *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent(&dirSnapshot,(cmStateSnapshot *)&stateDir);
      while (pcVar5 = cmStateSnapshot::GetState(&dirSnapshot), pcVar5 != (cmState *)0x0) {
        cmStateSnapshot::GetDirectory(&stateDir,&dirSnapshot);
        cVar4 = cmStateDirectory::GetProperty(&stateDir,&includeGuardVar);
        if (cVar4.Value != (string *)0x0) goto LAB_002396af;
        cmStateSnapshot::GetBuildsystemDirectoryParent(&local_48,&dirSnapshot);
      }
      cmMakefile::SetProperty(pcVar2,&includeGuardVar,"TRUE");
      goto LAB_002396b7;
    }
  }
  else {
    this = cmMakefile::GetCMakeInstance(pcVar2);
    cVar4 = cmake::GetProperty(this,&includeGuardVar);
    if (cVar4.Value == (string *)0x0) {
      cmake::SetProperty(this,&includeGuardVar,"TRUE");
      goto LAB_002396b7;
    }
  }
LAB_002396af:
  cmExecutionStatus::SetReturnInvoked(status);
LAB_002396b7:
  std::__cxx11::string::~string((string *)&includeGuardVar);
  return true;
}

Assistant:

bool cmIncludeGuardCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() > 1) {
    status.SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      status.SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    *status.GetMakefile().GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = &status.GetMakefile();

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinitionBool(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}